

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawListSharedData::ImDrawListSharedData(ImDrawListSharedData *this)

{
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  this->ArcFastVtx[0].x = 0.0;
  this->ArcFastVtx[0].y = 0.0;
  this->ArcFastVtx[1].x = 0.0;
  this->ArcFastVtx[1].y = 0.0;
  this->ArcFastVtx[2].x = 0.0;
  this->ArcFastVtx[2].y = 0.0;
  this->ArcFastVtx[3].x = 0.0;
  this->ArcFastVtx[3].y = 0.0;
  this->ArcFastVtx[4].x = 0.0;
  this->ArcFastVtx[4].y = 0.0;
  this->ArcFastVtx[5].x = 0.0;
  this->ArcFastVtx[5].y = 0.0;
  this->ArcFastVtx[6].x = 0.0;
  this->ArcFastVtx[6].y = 0.0;
  this->ArcFastVtx[7].x = 0.0;
  this->ArcFastVtx[7].y = 0.0;
  this->ArcFastVtx[8].x = 0.0;
  this->ArcFastVtx[8].y = 0.0;
  this->ArcFastVtx[9].x = 0.0;
  this->ArcFastVtx[9].y = 0.0;
  this->ArcFastVtx[10].x = 0.0;
  this->ArcFastVtx[10].y = 0.0;
  this->ArcFastVtx[0xb].x = 0.0;
  this->ArcFastVtx[0xb].y = 0.0;
  this->Font = (ImFont *)0x0;
  this->FontSize = 0.0;
  this->CurveTessellationTol = 0.0;
  lVar1 = 0;
  this->CircleSegmentMaxError = 0.0;
  (this->ClipRectFullscreen).x = -8192.0;
  (this->ClipRectFullscreen).y = -8192.0;
  (this->ClipRectFullscreen).z = 8192.0;
  (this->ClipRectFullscreen).w = 8192.0;
  this->InitialFlags = 0;
  do {
    fVar2 = (((float)(int)lVar1 + (float)(int)lVar1) * 3.1415927) / 12.0;
    fVar3 = cosf(fVar2);
    fVar2 = sinf(fVar2);
    this->ArcFastVtx[lVar1].x = fVar3;
    this->ArcFastVtx[lVar1].y = fVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xc);
  this->CircleSegmentCounts[0x30] = '\0';
  this->CircleSegmentCounts[0x31] = '\0';
  this->CircleSegmentCounts[0x32] = '\0';
  this->CircleSegmentCounts[0x33] = '\0';
  this->CircleSegmentCounts[0x34] = '\0';
  this->CircleSegmentCounts[0x35] = '\0';
  this->CircleSegmentCounts[0x36] = '\0';
  this->CircleSegmentCounts[0x37] = '\0';
  this->CircleSegmentCounts[0x38] = '\0';
  this->CircleSegmentCounts[0x39] = '\0';
  this->CircleSegmentCounts[0x3a] = '\0';
  this->CircleSegmentCounts[0x3b] = '\0';
  this->CircleSegmentCounts[0x3c] = '\0';
  this->CircleSegmentCounts[0x3d] = '\0';
  this->CircleSegmentCounts[0x3e] = '\0';
  this->CircleSegmentCounts[0x3f] = '\0';
  this->CircleSegmentCounts[0x20] = '\0';
  this->CircleSegmentCounts[0x21] = '\0';
  this->CircleSegmentCounts[0x22] = '\0';
  this->CircleSegmentCounts[0x23] = '\0';
  this->CircleSegmentCounts[0x24] = '\0';
  this->CircleSegmentCounts[0x25] = '\0';
  this->CircleSegmentCounts[0x26] = '\0';
  this->CircleSegmentCounts[0x27] = '\0';
  this->CircleSegmentCounts[0x28] = '\0';
  this->CircleSegmentCounts[0x29] = '\0';
  this->CircleSegmentCounts[0x2a] = '\0';
  this->CircleSegmentCounts[0x2b] = '\0';
  this->CircleSegmentCounts[0x2c] = '\0';
  this->CircleSegmentCounts[0x2d] = '\0';
  this->CircleSegmentCounts[0x2e] = '\0';
  this->CircleSegmentCounts[0x2f] = '\0';
  this->CircleSegmentCounts[0x10] = '\0';
  this->CircleSegmentCounts[0x11] = '\0';
  this->CircleSegmentCounts[0x12] = '\0';
  this->CircleSegmentCounts[0x13] = '\0';
  this->CircleSegmentCounts[0x14] = '\0';
  this->CircleSegmentCounts[0x15] = '\0';
  this->CircleSegmentCounts[0x16] = '\0';
  this->CircleSegmentCounts[0x17] = '\0';
  this->CircleSegmentCounts[0x18] = '\0';
  this->CircleSegmentCounts[0x19] = '\0';
  this->CircleSegmentCounts[0x1a] = '\0';
  this->CircleSegmentCounts[0x1b] = '\0';
  this->CircleSegmentCounts[0x1c] = '\0';
  this->CircleSegmentCounts[0x1d] = '\0';
  this->CircleSegmentCounts[0x1e] = '\0';
  this->CircleSegmentCounts[0x1f] = '\0';
  this->CircleSegmentCounts[0] = '\0';
  this->CircleSegmentCounts[1] = '\0';
  this->CircleSegmentCounts[2] = '\0';
  this->CircleSegmentCounts[3] = '\0';
  this->CircleSegmentCounts[4] = '\0';
  this->CircleSegmentCounts[5] = '\0';
  this->CircleSegmentCounts[6] = '\0';
  this->CircleSegmentCounts[7] = '\0';
  this->CircleSegmentCounts[8] = '\0';
  this->CircleSegmentCounts[9] = '\0';
  this->CircleSegmentCounts[10] = '\0';
  this->CircleSegmentCounts[0xb] = '\0';
  this->CircleSegmentCounts[0xc] = '\0';
  this->CircleSegmentCounts[0xd] = '\0';
  this->CircleSegmentCounts[0xe] = '\0';
  this->CircleSegmentCounts[0xf] = '\0';
  return;
}

Assistant:

ImDrawListSharedData::ImDrawListSharedData()
{
    Font = NULL;
    FontSize = 0.0f;
    CurveTessellationTol = 0.0f;
    CircleSegmentMaxError = 0.0f;
    ClipRectFullscreen = ImVec4(-8192.0f, -8192.0f, +8192.0f, +8192.0f);
    InitialFlags = ImDrawListFlags_None;

    // Lookup tables
    for (int i = 0; i < IM_ARRAYSIZE(ArcFastVtx); i++)
    {
        const float a = ((float)i * 2 * IM_PI) / (float)IM_ARRAYSIZE(ArcFastVtx);
        ArcFastVtx[i] = ImVec2(ImCos(a), ImSin(a));
    }
    memset(CircleSegmentCounts, 0, sizeof(CircleSegmentCounts)); // This will be set by SetCircleSegmentMaxError()
}